

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O2

tuple<double,_double> __thiscall
Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,int iteration,double pi,double po,
          double s)

{
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  uint action;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *strategy;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  Game *this_01;
  uint action_00;
  double *__wbegin;
  double dVar7;
  _Head_base<1UL,_double,_false> _Var8;
  double dVar9;
  tuple<double,_double> tVar10;
  undefined1 *puStack_160;
  undefined1 local_158 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  string infoSet;
  tuple<double,_double> ret;
  double local_38;
  
  this_01 = (Game *)CONCAT44(in_register_00000014,playerIndex);
  *(long *)&game[0x34].mTurnNum = *(long *)&game[0x34].mTurnNum + 1;
  puStack_160 = (undefined1 *)0x1118a6;
  dVar9 = po;
  bVar2 = Kuhn::Game::done(this_01);
  if (bVar2) {
    puStack_160 = (undefined1 *)0x1118b5;
    dVar7 = Kuhn::Game::payoff(this_01,iteration);
    _Var8._M_head_impl = dVar7 / s;
    (this->mEngine)._M_x[0] = 0x3ff0000000000000;
    (this->mEngine)._M_x[1] = (unsigned_long)_Var8._M_head_impl;
    ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl =
         (_Head_base<1UL,_double,_false>)(_Head_base<1UL,_double,_false>)dVar9;
  }
  else {
    puStack_160 = (undefined1 *)0x1118e1;
    Kuhn::Game::infoSetStr_abi_cxx11_
              ((string *)
               &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this_01);
    puStack_160 = (undefined1 *)0x1118e9;
    actionNum = Kuhn::Game::actionNum(this_01);
    puStack_160 = (undefined1 *)0x1118f8;
    iVar3 = Kuhn::Game::currentPlayer(this_01);
    if (*(char *)((long)game[0x35].mPayoff._M_elems[1] + (long)iVar3) == '\0') {
      puStack_160 = &LAB_00111bf4;
      __assert_fail("mUpdate[player] && \"Outcome sampling with stochastically-weighted averaging cannot treat static player.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/bakanaouji[P]cpp-cfr/RegretMinimization/Trainer/Trainer.cpp"
                    ,0x224,
                    "std::tuple<double, double> Trainer::Trainer<Kuhn::Game>::outcomeSamplingCFR(const T &, const int, const int, const double, const double, const double) [T = Kuhn::Game]"
                   );
    }
    puStack_160 = (undefined1 *)0x11192c;
    ppNVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&game[0x34].mCards,
                           (key_type *)
                           &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = *ppNVar4;
    if (this_00 == (mapped_type)0x0) {
      puStack_160 = (undefined1 *)0x11193c;
      this_00 = (mapped_type)operator_new(0x30);
      puStack_160 = (undefined1 *)0x11194a;
      Node::Node(this_00,actionNum);
      puStack_160 = (undefined1 *)0x111959;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&game[0x34].mCards,
                             (key_type *)
                             &dist._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      *ppNVar4 = this_00;
    }
    puStack_160 = (undefined1 *)0x111964;
    Node::updateStrategy(this_00);
    puStack_160 = (undefined1 *)0x11196c;
    strategy = Node::strategy(this_00);
    lVar1 = -((ulong)actionNum * 8 + 0xf & 0xfffffffffffffff0);
    __wbegin = (double *)(local_158 + lVar1);
    if (iVar3 == iteration) {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)actionNum) {
        uVar6 = (ulong)actionNum;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        __wbegin[uVar5] = strategy[uVar5] * 0.4 + 0.6 / (double)(int)actionNum;
      }
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)actionNum) {
        uVar6 = (ulong)actionNum;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        __wbegin[uVar5] = strategy[uVar5];
      }
    }
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111a13;
    std::discrete_distribution<int>::param_type::param_type<double*>
              ((param_type *)(game_cp.mInfoSets[1] + 9),__wbegin,__wbegin + (int)actionNum);
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111a23;
    action = std::discrete_distribution<int>::operator()
                       ((discrete_distribution<int> *)(game_cp.mInfoSets[1] + 9),
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)game);
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111a3d;
    Kuhn::Game::Game((Game *)local_158,this_01);
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111a50;
    Kuhn::Game::step((Game *)local_158,action);
    dVar9 = strategy[(int)action];
    local_38 = pi;
    if (iVar3 == iteration) {
      local_38 = pi * dVar9;
      dVar9 = 1.0;
    }
    dVar7 = __wbegin[(int)action];
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111aaa;
    outcomeSamplingCFR((Trainer<Kuhn::Game> *)((long)&infoSet.field_2 + 8),game,(int)local_158,
                       iteration,local_38,dVar9 * po,dVar7 * s);
    if (iVar3 == iteration) {
      action_00 = 0;
      if ((int)actionNum < 1) {
        actionNum = 0;
      }
      for (; actionNum != action_00; action_00 = action_00 + 1) {
        dVar9 = strategy[(int)action];
        *(undefined8 *)(local_158 + lVar1 + -8) = 0x111b22;
        dVar7 = Node::regretSum(this_00,action_00);
        if (action == action_00) {
          dVar9 = (1.0 - dVar9) *
                  po * (double)ret.super__Tuple_impl<0UL,_double,_double>.
                               super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>.
                               _M_head_impl * (double)infoSet.field_2._8_8_;
        }
        else {
          dVar9 = dVar9 * -(po * (double)ret.super__Tuple_impl<0UL,_double,_double>.
                                         super__Tuple_impl<1UL,_double>.
                                         super__Head_base<1UL,_double,_false>._M_head_impl) *
                          (double)infoSet.field_2._8_8_;
        }
        *(undefined8 *)(local_158 + lVar1 + -8) = 0x111b5e;
        Node::regretSum(this_00,action_00,dVar9 + dVar7);
      }
    }
    else {
      *(undefined8 *)(local_158 + lVar1 + -8) = 0x111b82;
      Node::strategySum(this_00,strategy,po / s);
    }
    (this->mEngine)._M_x[0] = (unsigned_long)((double)infoSet.field_2._8_8_ * strategy[(int)action])
    ;
    (this->mEngine)._M_x[1] =
         (unsigned_long)
         ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
         super__Head_base<1UL,_double,_false>._M_head_impl;
    *(undefined8 *)(local_158 + lVar1 + -8) = 0x111bb0;
    std::discrete_distribution<int>::param_type::~param_type
              ((param_type *)(game_cp.mInfoSets[1] + 9));
    puStack_160 = (undefined1 *)0x111bc3;
    _Var8._M_head_impl =
         (double)std::__cxx11::string::~string
                           ((string *)
                            &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  tVar10.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       (double)ret.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
               super__Head_base<1UL,_double,_false>._M_head_impl;
  tVar10.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       (_Head_base<1UL,_double,_false>)(_Head_base<1UL,_double,_false>)_Var8._M_head_impl;
  return (tuple<double,_double>)tVar10.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<double, double> Trainer<T>::outcomeSamplingCFR(const T &game, const int playerIndex, const int iteration , const double pi, const double po, const double s) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return std::make_tuple(game.payoff(playerIndex) / s, 1.0);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // outcome sampling with stochastically-weighted averaging cannot treat static player
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    assert(mUpdate[player] && "Outcome sampling with stochastically-weighted averaging cannot treat static player.");

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    node->updateStrategy();
    const double *strategy = node->strategy();

    // if current player is the target player, sample a single action according to epsilon-on-policy
    // otherwise, sample a single action according to the player's strategy
    const double epsilon = 0.6;
    double probability[actionNum];
    if (player == playerIndex) {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = (epsilon / (double) actionNum) + (1.0 - epsilon) * strategy[a];
        }
    } else {
        for (int a = 0; a < actionNum; ++a) {
            probability[a] = strategy[a];
        }
    }
    std::discrete_distribution<int> dist(probability, probability + actionNum);
    const int action = dist(mEngine);

    // for sampled action, recursively call cfr with additional history and probability
    double util, pTail;
    auto game_cp(game);
    game_cp.step(action);
    const double newPi = pi * (player == playerIndex ? strategy[action] : 1.0);
    const double newPo = po * (player == playerIndex ? 1.0 : strategy[action]);
    std::tuple<double, double> ret = outcomeSamplingCFR(game_cp, playerIndex, iteration, newPi, newPo, s * probability[action]);
    util = std::get<0>(ret);
    pTail = std::get<1>(ret);
    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        const double W = util * po;
        for (int a = 0; a < actionNum; ++a) {
            const double regret = a == action ? W * (1.0 - strategy[action]) * pTail : -W * pTail * strategy[action];
            const double regretSum = node->regretSum(a) + regret;
            node->regretSum(a, regretSum);
        }
    } else {
        // update average strategy
        node->strategySum(strategy, po / s);
    }
    return std::make_tuple(util, pTail * strategy[action]);
}